

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2FilterHandlers.cpp
# Opt level: O3

int __thiscall AttrList::getIndex(AttrList *this,XMLCh *qName)

{
  XMLCh XVar1;
  XMLCh XVar2;
  Attr *pAVar3;
  XMLCh *pXVar4;
  XMLCh *pXVar5;
  XMLSize_t getAt;
  
  if ((this->super_RefVectorOf<Attr>).super_BaseRefVectorOf<Attr>.fCurCount != 0) {
    getAt = 0;
    do {
      pAVar3 = xercesc_4_0::BaseRefVectorOf<Attr>::elementAt
                         (&(this->super_RefVectorOf<Attr>).super_BaseRefVectorOf<Attr>,getAt);
      pXVar4 = pAVar3->qName;
      if (pXVar4 == qName) goto LAB_00106d2f;
      pXVar5 = qName;
      if (pXVar4 == (XMLCh *)0x0 || qName == (XMLCh *)0x0) {
        if (pXVar4 == (XMLCh *)0x0) {
          if (qName == (XMLCh *)0x0) goto LAB_00106d2f;
LAB_00106d1e:
          XVar1 = *pXVar5;
        }
        else {
          XVar1 = *pXVar4;
          if ((qName != (XMLCh *)0x0) && (XVar1 == L'\0')) goto LAB_00106d1e;
        }
        if (XVar1 == L'\0') {
LAB_00106d2f:
          return (int)getAt;
        }
      }
      else {
        do {
          XVar1 = *pXVar4;
          if (XVar1 == L'\0') goto LAB_00106d1e;
          pXVar4 = pXVar4 + 1;
          XVar2 = *pXVar5;
          pXVar5 = pXVar5 + 1;
        } while (XVar1 == XVar2);
      }
      getAt = getAt + 1;
    } while (getAt < (this->super_RefVectorOf<Attr>).super_BaseRefVectorOf<Attr>.fCurCount);
  }
  return -1;
}

Assistant:

virtual int getIndex(const XMLCh* const qName ) const
    {
        for(XMLSize_t i=0;i<size();i++)
            if(XMLString::equals(elementAt(i)->qName,qName))
                return (int)i;
        return -1;
    }